

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

void __thiscall
FStateDefinitions::InstallStates(FStateDefinitions *this,PClassActor *info,AActor *defaults)

{
  FState *pFVar1;
  FStateDefine *pFVar2;
  FStateLabels *pFVar3;
  FName local_30;
  FName local_2c;
  FName local_28;
  FName local_24;
  
  if (defaults == (AActor *)0x0) {
    I_Error("Called InstallStates without actor defaults in %s",
            FName::NameData.NameArray
            [(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.Index]
            .Text);
  }
  pFVar1 = FindState(this,"Spawn");
  if (pFVar1 == (FState *)0x0) {
    pFVar1 = *(FState **)((AActor::RegistrationInfo.MyClass)->Defaults + 0x448);
    pFVar2 = FindStateAddress(this,"Spawn");
    pFVar2->State = pFVar1;
    pFVar2->DefineFlags = '\x01';
  }
  if (info->StateList != (FStateLabels *)0x0) {
    FStateLabels::Destroy(info->StateList);
    M_Free(info->StateList);
  }
  pFVar3 = CreateStateLabelList(&this->StateLabels);
  info->StateList = pFVar3;
  local_24.Index = 0x86;
  pFVar1 = PClassActor::FindState(info,&local_24);
  defaults->SpawnState = pFVar1;
  local_28.Index = 0x87;
  pFVar1 = PClassActor::FindState(info,&local_28);
  defaults->SeeState = pFVar1;
  local_2c.Index = 0x89;
  pFVar1 = PClassActor::FindState(info,&local_2c);
  defaults->MeleeState = pFVar1;
  local_30.Index = 0x8a;
  pFVar1 = PClassActor::FindState(info,&local_30);
  defaults->MissileState = pFVar1;
  return;
}

Assistant:

void FStateDefinitions::InstallStates(PClassActor *info, AActor *defaults)
{
	if (defaults == nullptr)
	{
		I_Error("Called InstallStates without actor defaults in %s", info->TypeName.GetChars());
	}

	// First ensure we have a valid spawn state.
	FState *state = FindState("Spawn");

	if (state == NULL)
	{
		// A NULL spawn state will crash the engine so set it to something valid.
		SetStateLabel("Spawn", GetDefault<AActor>()->SpawnState);
	}

	if (info->StateList != NULL) 
	{
		info->StateList->Destroy();
		M_Free(info->StateList);
	}
	info->StateList = CreateStateLabelList(StateLabels);

	// Cache these states as member veriables.
	defaults->SpawnState = info->FindState(NAME_Spawn);
	defaults->SeeState = info->FindState(NAME_See);
	// Melee and Missile states are manipulated by the scripted marines so they
	// have to be stored locally
	defaults->MeleeState = info->FindState(NAME_Melee);
	defaults->MissileState = info->FindState(NAME_Missile);
}